

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::LoopNestingDepth(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  uint32_t bb_id_00;
  uint32_t uVar1;
  
  bb_id_00 = LoopMergeBlock(this,bb_id);
  uVar1 = 0;
  for (; bb_id_00 != 0; bb_id_00 = LoopMergeBlock(this,bb_id_00)) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

uint32_t StructuredCFGAnalysis::LoopNestingDepth(uint32_t bb_id) {
  uint32_t result = 0;

  // Find the merge block of the current loop as long as the block is inside a
  // loop, exiting a loop for each iteration.
  for (uint32_t merge_block_id = LoopMergeBlock(bb_id); merge_block_id != 0;
       merge_block_id = LoopMergeBlock(merge_block_id)) {
    result++;
  }

  return result;
}